

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_ddos_flow_graph.cc
# Opt level: O3

int __thiscall
aliyun::Yundun::DdosFlowGraph
          (Yundun *this,YundunDdosFlowGraphRequestType *req,
          YundunDdosFlowGraphResponseType *response,YundunErrorInfo *error_info)

{
  vector<aliyun::YundunDdosFlowGraphTotalFlowType,_std::allocator<aliyun::YundunDdosFlowGraphTotalFlowType>_>
  *this_00;
  iterator *piVar1;
  pointer pcVar2;
  iterator __position;
  iterator __position_00;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  Int IVar6;
  char *pcVar7;
  AliRpcRequest *this_01;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint uVar14;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  allocator<char> local_369;
  undefined1 local_368 [32];
  long local_348;
  Value local_340;
  YundunDdosFlowGraphResponseType *local_328;
  long *local_320;
  long local_318;
  long local_310 [2];
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  local_300._M_string_length = 0;
  local_300.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_01 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_340);
  local_328 = response;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,this->secret_,&local_369);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_320,local_318 + (long)local_320);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_2e0.field_2._M_allocated_capacity = *psVar13;
    local_2e0.field_2._8_8_ = plVar8[3];
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar13;
    local_2e0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2e0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_01,&local_160,&local_180,&local_1a0,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_01,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_340,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DdosFlowGraph","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_01,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->instance_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"InstanceId","");
    pcVar2 = (req->instance_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->instance_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_01,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_type)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"InstanceType","");
    pcVar2 = (req->instance_type)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->instance_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_01,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_368);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_01,&local_2c0,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_01->super_AliHttpRequest)._vptr_AliHttpRequest)(this_01);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_01);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_01,&local_300);
    if (((0 < iVar4) && (local_300._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_300,&local_340,true), bVar3)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_340,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_340,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_368,pVVar10);
        }
        else {
          local_368._0_8_ = local_368 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_368,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_368);
        pcVar2 = local_368 + 0x10;
        if ((pointer)local_368._0_8_ != pcVar2) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_340,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_340,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_368,pVVar10);
        }
        else {
          local_368._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_368,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_368);
        if ((pointer)local_368._0_8_ != pcVar2) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_340,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_340,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_368,pVVar10);
        }
        else {
          local_368._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_368,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_368);
        if ((pointer)local_368._0_8_ != pcVar2) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_340,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_340,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_368,pVVar10);
        }
        else {
          local_368._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_368,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_368);
        if ((pointer)local_368._0_8_ != pcVar2) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
      }
      if (local_328 != (YundunDdosFlowGraphResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_340,"NormalFlows");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_340,"NormalFlows");
          bVar3 = Json::Value::isMember(pVVar10,"NormalFlow");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_340,"NormalFlows");
            pVVar10 = Json::Value::operator[](pVVar10,"NormalFlow");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar10), AVar5 != 0)) {
              uVar14 = 0;
              do {
                pVVar11 = Json::Value::operator[](pVVar10,uVar14);
                bVar3 = Json::Value::isMember(pVVar11,"time");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"time");
                  IVar6 = Json::Value::asInt(pVVar12);
                  local_368._0_8_ = SEXT48(IVar6);
                }
                bVar3 = Json::Value::isMember(pVVar11,"BitRecv");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"BitRecv");
                  IVar6 = Json::Value::asInt(pVVar12);
                  local_368._8_8_ = SEXT48(IVar6);
                }
                bVar3 = Json::Value::isMember(pVVar11,"BitSend");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"BitSend");
                  IVar6 = Json::Value::asInt(pVVar12);
                  local_368._16_8_ = SEXT48(IVar6);
                }
                bVar3 = Json::Value::isMember(pVVar11,"PktRecv");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"PktRecv");
                  IVar6 = Json::Value::asInt(pVVar12);
                  local_368._24_8_ = SEXT48(IVar6);
                }
                bVar3 = Json::Value::isMember(pVVar11,"PktSend");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"PktSend");
                  IVar6 = Json::Value::asInt(pVVar11);
                  local_348 = (long)IVar6;
                }
                __position._M_current = *(YundunDdosFlowGraphNormalFlowType **)&local_328->field_0x8
                ;
                if (__position._M_current ==
                    *(YundunDdosFlowGraphNormalFlowType **)&local_328->field_0x10) {
                  std::
                  vector<aliyun::YundunDdosFlowGraphNormalFlowType,std::allocator<aliyun::YundunDdosFlowGraphNormalFlowType>>
                  ::_M_realloc_insert<aliyun::YundunDdosFlowGraphNormalFlowType_const&>
                            ((vector<aliyun::YundunDdosFlowGraphNormalFlowType,std::allocator<aliyun::YundunDdosFlowGraphNormalFlowType>>
                              *)local_328,__position,(YundunDdosFlowGraphNormalFlowType *)local_368)
                  ;
                }
                else {
                  (__position._M_current)->pkt_send = local_348;
                  (__position._M_current)->bit_send = local_368._16_8_;
                  (__position._M_current)->pkt_recv = local_368._24_8_;
                  (__position._M_current)->time = local_368._0_8_;
                  (__position._M_current)->bit_recv = local_368._8_8_;
                  *(long *)&local_328->field_0x8 = *(long *)&local_328->field_0x8 + 0x28;
                }
                AVar5 = Json::Value::size(pVVar10);
                uVar14 = uVar14 + 1;
              } while (uVar14 < AVar5);
            }
          }
        }
        bVar3 = Json::Value::isMember(&local_340,"TotalFlows");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_340,"TotalFlows");
          bVar3 = Json::Value::isMember(pVVar10,"TotalFlow");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_340,"TotalFlows");
            pVVar10 = Json::Value::operator[](pVVar10,"TotalFlow");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar10), AVar5 != 0)) {
              this_00 = &local_328->total_flows;
              uVar14 = 0;
              do {
                pVVar11 = Json::Value::operator[](pVVar10,uVar14);
                bVar3 = Json::Value::isMember(pVVar11,"time");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"time");
                  IVar6 = Json::Value::asInt(pVVar12);
                  local_368._0_8_ = SEXT48(IVar6);
                }
                bVar3 = Json::Value::isMember(pVVar11,"BitRecv");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"BitRecv");
                  IVar6 = Json::Value::asInt(pVVar12);
                  local_368._8_8_ = SEXT48(IVar6);
                }
                bVar3 = Json::Value::isMember(pVVar11,"PktRecv");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"PktRecv");
                  IVar6 = Json::Value::asInt(pVVar11);
                  local_368._16_8_ = SEXT48(IVar6);
                }
                __position_00._M_current =
                     *(YundunDdosFlowGraphTotalFlowType **)&local_328->field_0x20;
                if (__position_00._M_current ==
                    *(YundunDdosFlowGraphTotalFlowType **)&local_328->field_0x28) {
                  std::
                  vector<aliyun::YundunDdosFlowGraphTotalFlowType,std::allocator<aliyun::YundunDdosFlowGraphTotalFlowType>>
                  ::_M_realloc_insert<aliyun::YundunDdosFlowGraphTotalFlowType_const&>
                            ((vector<aliyun::YundunDdosFlowGraphTotalFlowType,std::allocator<aliyun::YundunDdosFlowGraphTotalFlowType>>
                              *)this_00,__position_00,(YundunDdosFlowGraphTotalFlowType *)local_368)
                  ;
                }
                else {
                  (__position_00._M_current)->pkt_recv = local_368._16_8_;
                  (__position_00._M_current)->time = local_368._0_8_;
                  (__position_00._M_current)->bit_recv = local_368._8_8_;
                  *(long *)&local_328->field_0x20 = *(long *)&local_328->field_0x20 + 0x18;
                }
                AVar5 = Json::Value::size(pVVar10);
                uVar14 = uVar14 + 1;
              } while (uVar14 < AVar5);
            }
          }
        }
      }
      goto LAB_0012fc15;
    }
    if (error_info == (YundunErrorInfo *)0x0) goto LAB_0012fc10;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (YundunErrorInfo *)0x0) {
LAB_0012fc10:
      iVar4 = -1;
      goto LAB_0012fc15;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_0012fc15:
  AliRpcRequest::~AliRpcRequest(this_01);
  operator_delete(this_01,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_340);
  if (local_320 != local_310) {
    operator_delete(local_320,local_310[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,
                    CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,
                             local_300.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Yundun::DdosFlowGraph(const YundunDdosFlowGraphRequestType& req,
                      YundunDdosFlowGraphResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DdosFlowGraph");
  if(!req.instance_id.empty()) {
    req_rpc->AddRequestQuery("InstanceId", req.instance_id);
  }
  if(!req.instance_type.empty()) {
    req_rpc->AddRequestQuery("InstanceType", req.instance_type);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}